

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::setFilterOnWrite(QPDFObjectHandle *this,bool val)

{
  QPDFObjectHandle local_28;
  byte local_11;
  QPDFObjectHandle *pQStack_10;
  bool val_local;
  QPDFObjectHandle *this_local;
  
  local_11 = val;
  pQStack_10 = this;
  as_stream(&local_28,(typed)this);
  ::qpdf::Stream::setFilterOnWrite((Stream *)&local_28,(bool)(local_11 & 1));
  ::qpdf::Stream::~Stream((Stream *)&local_28);
  return;
}

Assistant:

void
QPDFObjectHandle::setFilterOnWrite(bool val)
{
    as_stream(error).setFilterOnWrite(val);
}